

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperationSingleQueueTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::synchronization::anon_unknown_2::FenceTestInstance::iterate
          (TestStatus *__return_storage_ptr__,FenceTestInstance *this)

{
  VkPhysicalDevice pVVar1;
  DeviceInterface *vk;
  VkDevice device;
  MultiQueues *this_00;
  long *plVar2;
  OperationContext *context;
  FenceTestInstance *pFVar3;
  VkCommandBuffer_s *commandBuffer;
  VkCommandBuffer_s *commandBuffer_00;
  VkQueueFlags flagsWrite;
  VkQueueFlags flagsRead;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Resource *pRVar7;
  VkAccessFlags extraout_var;
  VkAccessFlags extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar8;
  void *__s1;
  void *__s2;
  pointer pQVar9;
  long lVar10;
  allocator<char> local_181;
  FenceTestInstance *local_180;
  TestStatus *local_178;
  UniquePtr<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
  resource;
  UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  readOp;
  UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  writeOp;
  SyncInfo local_138;
  SyncInfo local_128;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool [2];
  VkCommandBuffer cmdBuffers [2];
  vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
  queuePairs;
  Move<vk::VkCommandBuffer_s_*> ptrCmdBuffer [2];
  string local_50;
  
  pVVar1 = (this->super_BaseTestInstance).m_opContext.m_physicalDevice;
  vk = *(DeviceInterface **)(pVVar1 + 8);
  device = *(VkDevice *)(pVVar1 + 0x18);
  this_00 = (MultiQueues *)(this->super_BaseTestInstance).m_opContext.m_vki;
  local_178 = __return_storage_ptr__;
  flagsWrite = (**(code **)(*(long *)(this->super_BaseTestInstance).m_resource.
                                     super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                     .m_data.ptr + 0x18))();
  plVar2 = *(long **)&(this->super_BaseTestInstance).m_resource.
                      super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                      .m_data.field_0x8;
  flagsRead = (**(code **)(*plVar2 + 0x18))
                        (plVar2,(this->super_BaseTestInstance).m_opContext.m_physicalDevice);
  MultiQueues::getQueuesPairs(&queuePairs,this_00,flagsWrite,flagsRead);
  uVar8 = 0;
  local_180 = this;
  do {
    pQVar9 = queuePairs.
             super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pFVar3 = local_180;
    if ((((long)queuePairs.
                super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)queuePairs.
               super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
               ._M_impl.super__Vector_impl_data._M_start) / 0x18 & 0xffffffffU) <= uVar8) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)cmdPool,"OK",(allocator<char> *)ptrCmdBuffer);
      tcu::TestStatus::pass(local_178,(string *)cmdPool);
      std::__cxx11::string::~string((string *)cmdPool);
      break;
    }
    pRVar7 = (Resource *)operator_new(0x80);
    context = (OperationContext *)(pFVar3->super_BaseTestInstance).m_opContext.m_physicalDevice;
    uVar4 = (**(code **)(*(long *)(pFVar3->super_BaseTestInstance).m_resource.
                                  super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                  .m_data.ptr + 0x10))();
    uVar5 = (**(code **)(**(long **)&(pFVar3->super_BaseTestInstance).m_resource.
                                     super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                     .m_data.field_0x8 + 0x10))();
    cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
    cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
         (VkDevice)0x0;
    Resource::Resource(pRVar7,context,
                       (ResourceDescription *)
                       &(this->super_BaseTestInstance).m_opContext.m_allocator,uVar5 | uVar4,
                       VK_SHARING_MODE_EXCLUSIVE,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)cmdPool);
    resource.
    super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
    .m_data.ptr = pRVar7;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)cmdPool);
    pFVar3 = local_180;
    pRVar7 = (local_180->super_BaseTestInstance).m_resource.
             super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
             .m_data.ptr;
    (**(code **)(*(long *)pRVar7 + 0x28))
              (cmdPool,pRVar7,(local_180->super_BaseTestInstance).m_opContext.m_physicalDevice,
               resource.
               super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
               .m_data.ptr);
    writeOp.
    super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    .m_data.ptr = (Operation *)
                  cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object;
    cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
    de::details::
    UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    ::~UniqueBase((UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                   *)cmdPool);
    plVar2 = *(long **)&(pFVar3->super_BaseTestInstance).m_resource.
                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                        .m_data.field_0x8;
    (**(code **)(*plVar2 + 0x28))
              (cmdPool,plVar2,(pFVar3->super_BaseTestInstance).m_opContext.m_physicalDevice,
               resource.
               super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
               .m_data.ptr);
    readOp.
    super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    .m_data.ptr = (Operation *)
                  cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object;
    cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
    de::details::
    UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    ::~UniqueBase((UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                   *)cmdPool);
    ::vk::createCommandPool
              (cmdPool,vk,device,2,pQVar9[uVar8].familyIndexWrite,(VkAllocationCallbacks *)0x0);
    pQVar9 = pQVar9 + uVar8;
    ::vk::createCommandPool
              (cmdPool + 1,vk,device,2,pQVar9->familyIndexRead,(VkAllocationCallbacks *)0x0);
    makeCommandBuffer(ptrCmdBuffer,vk,device,
                      (VkCommandPool)
                      cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                      m_internal);
    makeCommandBuffer(ptrCmdBuffer + 1,vk,device,
                      (VkCommandPool)
                      cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                      m_internal);
    commandBuffer_00 = ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    commandBuffer = ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    cmdBuffers[0] = ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    cmdBuffers[1] = ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    local_128.stageMask =
         (*(writeOp.
            super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
            .m_data.ptr)->_vptr_Operation[3])();
    local_128.accessMask = extraout_var;
    local_138.stageMask =
         (*(readOp.
            super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
            .m_data.ptr)->_vptr_Operation[3])();
    local_138.accessMask = extraout_var_00;
    beginCommandBuffer(vk,commandBuffer);
    (*(writeOp.
       super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
       .m_data.ptr)->_vptr_Operation[2])
              (writeOp.
               super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
               .m_data.ptr,commandBuffer);
    createBarrierMultiQueue
              (vk,cmdBuffers,&local_128,&local_138,
               resource.
               super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
               .m_data.ptr,pQVar9->familyIndexWrite,pQVar9->familyIndexRead,
               *(VkSharingMode *)
                &(local_180->super_BaseTestInstance).m_writeOp.
                 super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                 .m_data.ptr,false);
    endCommandBuffer(vk,commandBuffer);
    submitCommandsAndWait(vk,device,pQVar9->queueWrite,commandBuffer);
    beginCommandBuffer(vk,commandBuffer_00);
    createBarrierMultiQueue
              (vk,cmdBuffers + 1,&local_128,&local_138,
               resource.
               super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
               .m_data.ptr,pQVar9->familyIndexWrite,pQVar9->familyIndexRead,
               *(VkSharingMode *)
                &(local_180->super_BaseTestInstance).m_writeOp.
                 super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                 .m_data.ptr,true);
    (*(readOp.
       super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
       .m_data.ptr)->_vptr_Operation[2])
              (readOp.
               super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
               .m_data.ptr,commandBuffer_00);
    endCommandBuffer(vk,commandBuffer_00);
    submitCommandsAndWait(vk,device,pQVar9->queueRead,commandBuffer_00);
    iVar6 = (*(writeOp.
               super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
               .m_data.ptr)->_vptr_Operation[4])();
    (*(readOp.
       super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
       .m_data.ptr)->_vptr_Operation[4])();
    iVar6 = bcmp(__s1,__s2,CONCAT44(extraout_var_01,iVar6));
    if (iVar6 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Memory contents don\'t match",&local_181);
      tcu::TestStatus::fail(local_178,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    lVar10 = 0x20;
    do {
      ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
                ((RefBase<vk::VkCommandBuffer_s_*> *)
                 ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object +
                 lVar10));
      lVar10 = lVar10 + -0x20;
    } while (lVar10 != -0x20);
    lVar10 = 0x20;
    do {
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)24>_> *)
                 ((long)&cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                         m_internal + lVar10));
      lVar10 = lVar10 + -0x20;
    } while (lVar10 != -0x20);
    de::details::
    UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    ::~UniqueBase(&readOp.
                   super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                 );
    de::details::
    UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    ::~UniqueBase(&writeOp.
                   super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                 );
    de::details::
    UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
    ::~UniqueBase(&resource.
                   super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                 );
    uVar8 = uVar8 + 1;
  } while (iVar6 == 0);
  std::
  vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
  ::~vector(&queuePairs);
  return local_178;
}

Assistant:

tcu::TestStatus	iterate (void)
	{
		enum {WRITE=0, READ, COUNT};
		const DeviceInterface&			vk					= m_context.getDeviceInterface();
		const VkDevice					device				= m_context.getDevice();
		const VkQueue					queue				= m_context.getUniversalQueue();
		const deUint32					queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
		const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Move<VkCommandBuffer>		ptrCmdBuffer[COUNT]	= {makeCommandBuffer(vk, device, *cmdPool), makeCommandBuffer(vk, device, *cmdPool)};
		VkCommandBuffer					cmdBuffers[COUNT]	= {*ptrCmdBuffer[WRITE], *ptrCmdBuffer[READ]};
		const SyncInfo					writeSync			= m_writeOp->getSyncInfo();
		const SyncInfo					readSync			= m_readOp->getSyncInfo();

		beginCommandBuffer(vk, cmdBuffers[WRITE]);

		m_writeOp->recordCommands(cmdBuffers[WRITE]);

		if (m_resource->getType() == RESOURCE_TYPE_IMAGE)
		{
			const VkImageMemoryBarrier barrier =  makeImageMemoryBarrier(writeSync.accessMask, readSync.accessMask,
				writeSync.imageLayout, readSync.imageLayout, m_resource->getImage().handle, m_resource->getImage().subresourceRange);
			vk.cmdPipelineBarrier(cmdBuffers[WRITE],  writeSync.stageMask, readSync.stageMask, (VkDependencyFlags)0, 0u, (const VkMemoryBarrier*)DE_NULL, 0u, (const VkBufferMemoryBarrier*)DE_NULL, 1u, &barrier);
		}

		endCommandBuffer(vk, cmdBuffers[WRITE]);

		submitCommandsAndWait(vk, device, queue, cmdBuffers[WRITE]);

		beginCommandBuffer(vk, cmdBuffers[READ]);

		m_readOp->recordCommands(cmdBuffers[READ]);

		endCommandBuffer(vk, cmdBuffers[READ]);

		submitCommandsAndWait(vk, device, queue, cmdBuffers[READ]);

		{
			const Data	expected = m_writeOp->getData();
			const Data	actual	 = m_readOp->getData();

			if (0 != deMemCmp(expected.data, actual.data, expected.size))
				return tcu::TestStatus::fail("Memory contents don't match");
		}

		return tcu::TestStatus::pass("OK");
	}